

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void Catch::defaultListListeners
               (ostream *out,
               vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
               *descriptions)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pLVar2;
  char *pcVar3;
  pointer pcVar4;
  pointer pLVar5;
  pointer pLVar6;
  pointer pLVar7;
  long *plVar8;
  long *plVar9;
  pointer pLVar10;
  char local_119;
  long *local_118;
  long local_110;
  long local_108;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  long *local_f8;
  ulong local_f0;
  long local_e8 [2];
  Column local_d8;
  pointer local_a0;
  size_t local_98;
  size_type local_90;
  size_t local_88;
  Column local_80;
  Columns local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"Registered listeners:\n",0x16);
  pLVar10 = (descriptions->
            super__Vector_base<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pLVar2 = (descriptions->
           super__Vector_base<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pLVar7 = pLVar10;
  pLVar6 = pLVar10;
  if (pLVar10 != pLVar2) {
    while (pLVar5 = pLVar7, pLVar6 = pLVar6 + 1, pLVar6 != pLVar2) {
      pLVar7 = pLVar6;
      if ((pLVar6->name).m_size <= (pLVar5->name).m_size) {
        pLVar7 = pLVar5;
      }
    }
    if (pLVar10 != pLVar2) {
      local_90 = (pLVar5->name).m_size;
      local_88 = local_90 + 5;
      paVar1 = &local_80.m_string.field_2;
      local_98 = 0x48 - local_90;
      local_a0 = pLVar2;
      do {
        pcVar3 = (pLVar10->name).m_start;
        local_f8 = local_e8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f8,pcVar3,pcVar3 + (pLVar10->name).m_size);
        plVar8 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_f8,local_f0,0,'\x01');
        local_118 = &local_108;
        plVar9 = plVar8 + 2;
        if ((long *)*plVar8 == plVar9) {
          local_108 = *plVar9;
          uStack_100 = (undefined4)plVar8[3];
          uStack_fc = *(undefined4 *)((long)plVar8 + 0x1c);
        }
        else {
          local_108 = *plVar9;
          local_118 = (long *)*plVar8;
        }
        local_110 = plVar8[1];
        *plVar8 = (long)plVar9;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        local_d8.m_string._M_dataplus._M_p = (pointer)&local_d8.m_string.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d8,local_118,local_110 + (long)local_118);
        local_d8.m_width = 0x4f;
        local_d8.m_initialIndent = 0xffffffffffffffff;
        local_d8.m_indent = 2;
        if (local_88 == 0) {
LAB_0015f486:
          __assert_fail("newWidth > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                        ,0x2862,"Column &Catch::TextFlow::Column::width(size_t)");
        }
        local_d8.m_width = local_88;
        pcVar4 = (pLVar10->description)._M_dataplus._M_p;
        local_80.m_string._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,pcVar4,pcVar4 + (pLVar10->description)._M_string_length);
        local_80.m_width = 0x4f;
        local_80.m_initialIndent = 0;
        local_80.m_indent = 2;
        if (local_90 == 0x48) goto LAB_0015f486;
        local_80.m_width = local_98;
        TextFlow::Column::operator+(&local_48,&local_d8,&local_80);
        TextFlow::operator<<(out,&local_48);
        local_119 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(out,&local_119,1);
        std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::~vector
                  (&local_48.m_columns);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80.m_string._M_dataplus._M_p != paVar1) {
          operator_delete(local_80.m_string._M_dataplus._M_p,
                          local_80.m_string.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8.m_string._M_dataplus._M_p != &local_d8.m_string.field_2) {
          operator_delete(local_d8.m_string._M_dataplus._M_p,
                          local_d8.m_string.field_2._M_allocated_capacity + 1);
        }
        if (local_118 != &local_108) {
          operator_delete(local_118,local_108 + 1);
        }
        if (local_f8 != local_e8) {
          operator_delete(local_f8,local_e8[0] + 1);
        }
        pLVar10 = pLVar10 + 1;
      } while (pLVar10 != local_a0);
    }
    local_d8.m_string._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_d8,1);
    std::ostream::flush();
  }
  return;
}

Assistant:

void defaultListListeners( std::ostream& out,
                               std::vector<ListenerDescription> const& descriptions ) {
        out << "Registered listeners:\n";

        if(descriptions.empty()) {
            return;
        }

        const auto maxNameLen =
            std::max_element( descriptions.begin(),
                              descriptions.end(),
                              []( ListenerDescription const& lhs,
                                  ListenerDescription const& rhs ) {
                                  return lhs.name.size() < rhs.name.size();
                              } )
                ->name.size();

        for ( auto const& desc : descriptions ) {
            out << TextFlow::Column( static_cast<std::string>( desc.name ) +
                                     ':' )
                           .indent( 2 )
                           .width( maxNameLen + 5 ) +
                       TextFlow::Column( desc.description )
                           .initialIndent( 0 )
                           .indent( 2 )
                           .width( CATCH_CONFIG_CONSOLE_WIDTH - maxNameLen - 8 )
                << '\n';
        }

        out << '\n' << std::flush;
    }